

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::
     __insertion_sort<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
               (iterator __first,EnumNameValue *__last)

{
  int iVar1;
  Data *pDVar2;
  qsizetype qVar3;
  QArrayData *data;
  QArrayData *data_00;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  iterator __last_00;
  
  if (__first.i != __last) {
    for (__last_00.i = __first.i + 1; __last_00.i != __last; __last_00.i = __last_00.i + 1) {
      iVar1 = (__last_00.i)->value;
      if (iVar1 < (__first.i)->value) {
        pDVar2 = ((__last_00.i)->name).d.d;
        pcVar4 = ((__last_00.i)->name).d.ptr;
        qVar5 = ((__last_00.i)->name).d.size;
        ((__last_00.i)->name).d.d = (Data *)0x0;
        ((__last_00.i)->name).d.ptr = (char16_t *)0x0;
        ((__last_00.i)->name).d.size = 0;
        qVar3 = ((__last_00.i)->valueStr).d.size;
        ((__last_00.i)->valueStr).d.size = 0;
        pDVar6 = ((__last_00.i)->valueStr).d.d;
        pcVar7 = ((__last_00.i)->valueStr).d.ptr;
        ((__last_00.i)->valueStr).d.d = (Data *)0x0;
        ((__last_00.i)->valueStr).d.ptr = (char16_t *)0x0;
        __copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<QList<EnumNameValue>::iterator,QList<EnumNameValue>::iterator>
                  (__first,__last_00,__last_00.i + 1);
        data = &(((__first.i)->name).d.d)->super_QArrayData;
        data_00 = &(((__first.i)->valueStr).d.d)->super_QArrayData;
        ((__first.i)->name).d.d = pDVar2;
        ((__first.i)->name).d.ptr = pcVar4;
        ((__first.i)->name).d.size = qVar5;
        ((__first.i)->valueStr).d.d = pDVar6;
        ((__first.i)->valueStr).d.ptr = pcVar7;
        ((__first.i)->valueStr).d.size = qVar3;
        (__first.i)->value = iVar1;
        if (data_00 != (QArrayData *)0x0) {
          LOCK();
          (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
               (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data_00,2,0x10);
          }
        }
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
      else {
        __unguarded_linear_insert<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Val_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                  (__last_00.i);
      }
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }